

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void combine_interintra_highbd
               (INTERINTRA_MODE mode,int8_t use_wedge_interintra,int8_t wedge_index,
               int8_t wedge_sign,BLOCK_SIZE bsize,BLOCK_SIZE plane_bsize,uint8_t *comppred8,
               int compstride,uint8_t *interpred8,int interstride,uint8_t *intrapred8,
               int intrastride,int bd)

{
  int iVar1;
  int8_t in_CL;
  int8_t in_DL;
  char in_SIL;
  BLOCK_SIZE in_R8B;
  byte in_R9B;
  uint8_t *in_stack_00000008;
  uint32_t in_stack_00000010;
  uint8_t *in_stack_00000018;
  uint32_t in_stack_00000020;
  uint8_t *in_stack_00000028;
  uint32_t in_stack_00000030;
  int in_stack_00000038;
  uint8_t mask [16384];
  int subw;
  int subh;
  uint8_t *mask_1;
  int bh;
  int bw;
  undefined4 in_stack_ffffffffffffbf88;
  int in_stack_ffffffffffffbf8c;
  undefined4 in_stack_ffffffffffffbf90;
  undefined4 in_stack_ffffffffffffbf94;
  uint8_t local_4048 [16384];
  uint local_48;
  uint local_44;
  uint8_t *local_40;
  uint local_38;
  uint local_34;
  BLOCK_SIZE local_2d;
  int8_t local_2c;
  int8_t local_2b;
  
  local_34 = (uint)block_size_wide[in_R9B];
  local_38 = (uint)block_size_high[in_R9B];
  if (in_SIL == '\0') {
    build_smooth_interintra_mask
              ((uint8_t *)CONCAT44(in_stack_ffffffffffffbf94,in_stack_ffffffffffffbf90),
               in_stack_ffffffffffffbf8c,(BLOCK_SIZE)((uint)in_stack_ffffffffffffbf88 >> 0x18),
               (INTERINTRA_MODE)((uint)in_stack_ffffffffffffbf88 >> 0x10));
    (*aom_highbd_blend_a64_mask)
              (in_stack_00000008,in_stack_00000010,in_stack_00000028,in_stack_00000030,
               in_stack_00000018,in_stack_00000020,local_4048,local_34,local_34,local_38,0,0,
               in_stack_00000038);
  }
  else {
    local_2d = in_R8B;
    local_2c = in_CL;
    local_2b = in_DL;
    iVar1 = av1_is_wedge_used(in_R8B);
    if (iVar1 != 0) {
      local_40 = av1_get_contiguous_soft_mask(local_2b,local_2c,local_2d);
      local_44 = (uint)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                              [local_2d] << 1 == local_38);
      local_48 = (uint)((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                              [local_2d] << 1 == local_34);
      (*aom_highbd_blend_a64_mask)
                (in_stack_00000008,in_stack_00000010,in_stack_00000028,in_stack_00000030,
                 in_stack_00000018,in_stack_00000020,local_40,(uint32_t)block_size_wide[local_2d],
                 local_34,local_38,local_48,local_44,in_stack_00000038);
    }
  }
  return;
}

Assistant:

static inline void combine_interintra_highbd(
    INTERINTRA_MODE mode, int8_t use_wedge_interintra, int8_t wedge_index,
    int8_t wedge_sign, BLOCK_SIZE bsize, BLOCK_SIZE plane_bsize,
    uint8_t *comppred8, int compstride, const uint8_t *interpred8,
    int interstride, const uint8_t *intrapred8, int intrastride, int bd) {
  const int bw = block_size_wide[plane_bsize];
  const int bh = block_size_high[plane_bsize];

  if (use_wedge_interintra) {
    if (av1_is_wedge_used(bsize)) {
      const uint8_t *mask =
          av1_get_contiguous_soft_mask(wedge_index, wedge_sign, bsize);
      const int subh = 2 * mi_size_high[bsize] == bh;
      const int subw = 2 * mi_size_wide[bsize] == bw;
      aom_highbd_blend_a64_mask(comppred8, compstride, intrapred8, intrastride,
                                interpred8, interstride, mask,
                                block_size_wide[bsize], bw, bh, subw, subh, bd);
    }
    return;
  }

  uint8_t mask[MAX_SB_SQUARE];
  build_smooth_interintra_mask(mask, bw, plane_bsize, mode);
  aom_highbd_blend_a64_mask(comppred8, compstride, intrapred8, intrastride,
                            interpred8, interstride, mask, bw, bw, bh, 0, 0,
                            bd);
}